

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_test.c
# Opt level: O2

void consumer_mu_n(testing t,mu_queue *q,int start,int count)

{
  nsync_mu *mu;
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *pcVar4;
  uint uVar5;
  void *pvVar6;
  uint uVar7;
  ulong in_stack_ffffffffffffffc0;
  
  mu = &q->mu;
  for (uVar7 = 0; uVar7 != 300000; uVar7 = uVar7 + 3) {
    nsync::nsync_mu_lock(mu);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_stack_ffffffffffffffc0;
    iVar3 = nsync::nsync_mu_wait_with_deadline
                      ((nsync *)mu,(nsync_mu *)mu_queue_non_empty,(_func_int_void_ptr *)q,
                       (void *)0x0,(_func_int_void_ptr_void_ptr *)0x7fffffffffffffff,
                       (nsync_time)(auVar2 << 0x40),(nsync_note)0x3b9ac9ff);
    pvVar6 = (void *)0x0;
    if (iVar3 == 0) {
      iVar3 = q->count;
      if (iVar3 == 0) {
        testing_panic("q->count == 0");
        iVar3 = q->count;
      }
      iVar1 = q->pos;
      pvVar6 = q->data[iVar1];
      q->data[iVar1] = (void *)0x0;
      q->pos = iVar1 + 1;
      q->count = iVar3 + -1;
      if (iVar1 + 1 == q->limit) {
        q->pos = 0;
      }
    }
    nsync::nsync_mu_unlock(mu);
    if (pvVar6 == (void *)0x0) {
      pcVar4 = smprintf("mu_queue_get() returned 0 with no deadline");
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/mu_wait_test.c"
                     ,0x80,pcVar4);
    }
    uVar5 = (int)pvVar6 - 0x10b189;
    if (uVar7 != uVar5) {
      pcVar4 = smprintf("mu_queue_get() returned bad value; want %d, got %d",(ulong)uVar7,
                        (ulong)uVar5);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O2/cpp/testing/mu_wait_test.c"
                     ,0x85,pcVar4);
    }
  }
  return;
}

Assistant:

static void consumer_mu_n (testing t, mu_queue *q, int start, int count) {
	int i;
	for (i = 0; i != count; i++) {
		void *v = mu_queue_get (q, nsync_time_no_deadline);
		int x;
		if (v == NULL) {
			TEST_FATAL (t, ("mu_queue_get() returned 0 with no deadline"));
		}
		x = PTR_TO_INT (v);
		if (x != (start+i)*3) {
			TEST_FATAL (t, ("mu_queue_get() returned bad value; want %d, got %d",
				   (start+i)*3, x));
		}
	}
}